

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

FilterHandle __thiscall
pbrt::FilterHandle::Create
          (FilterHandle *this,string *name,ParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  GaussianFilter *pGVar2;
  ulong uVar3;
  char *pcVar4;
  
  pcVar4 = "box";
  bVar1 = std::operator==(name,"box");
  if (bVar1) {
    pGVar2 = (GaussianFilter *)BoxFilter::Create(parameters,(FileLoc *)pcVar4,alloc);
    uVar3 = 0x1000000000000;
  }
  else {
    pcVar4 = "gaussian";
    bVar1 = std::operator==(name,"gaussian");
    if (bVar1) {
      pGVar2 = GaussianFilter::Create(parameters,(FileLoc *)pcVar4,alloc);
      uVar3 = 0x2000000000000;
    }
    else {
      pcVar4 = "mitchell";
      bVar1 = std::operator==(name,"mitchell");
      if (bVar1) {
        pGVar2 = (GaussianFilter *)MitchellFilter::Create(parameters,(FileLoc *)pcVar4,alloc);
        uVar3 = 0x3000000000000;
      }
      else {
        pcVar4 = "sinc";
        bVar1 = std::operator==(name,"sinc");
        if (bVar1) {
          pGVar2 = (GaussianFilter *)LanczosSincFilter::Create(parameters,(FileLoc *)pcVar4,alloc);
          uVar3 = 0x4000000000000;
        }
        else {
          pcVar4 = "triangle";
          bVar1 = std::operator==(name,"triangle");
          if (!bVar1) {
            pcVar4 = "%s: filter type unknown.";
            goto LAB_0038b9d5;
          }
          pGVar2 = (GaussianFilter *)TriangleFilter::Create(parameters,(FileLoc *)pcVar4,alloc);
          uVar3 = 0x5000000000000;
        }
      }
    }
  }
  (this->
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  ).bits = uVar3 | (ulong)pGVar2;
  if (((ulong)pGVar2 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (FilterHandle)
           (TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
            )this;
  }
  pcVar4 = "%s: unable to create filter.";
LAB_0038b9d5:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar4,name);
}

Assistant:

FilterHandle FilterHandle::Create(const std::string &name,
                                  const ParameterDictionary &parameters,
                                  const FileLoc *loc, Allocator alloc) {
    FilterHandle filter = nullptr;
    if (name == "box")
        filter = BoxFilter::Create(parameters, loc, alloc);
    else if (name == "gaussian")
        filter = GaussianFilter::Create(parameters, loc, alloc);
    else if (name == "mitchell")
        filter = MitchellFilter::Create(parameters, loc, alloc);
    else if (name == "sinc")
        filter = LanczosSincFilter::Create(parameters, loc, alloc);
    else if (name == "triangle")
        filter = TriangleFilter::Create(parameters, loc, alloc);
    else
        ErrorExit(loc, "%s: filter type unknown.", name);

    if (!filter)
        ErrorExit(loc, "%s: unable to create filter.", name);

    parameters.ReportUnused();
    return filter;
}